

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRampFlightType::IfcRampFlightType(IfcRampFlightType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcRampFlightType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00843760);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x843630;
  *(undefined8 *)&this->field_0x1c0 = 0x843748;
  *(undefined8 *)&this->field_0x88 = 0x843658;
  *(undefined8 *)&this->field_0x98 = 0x843680;
  *(undefined8 *)&this->field_0xf0 = 0x8436a8;
  *(undefined8 *)&this->field_0x148 = 0x8436d0;
  *(undefined8 *)&this->field_0x180 = 0x8436f8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x843720;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRampFlightType() : Object("IfcRampFlightType") {}